

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderBool
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  CodedInputStream *pCVar2;
  byte *pbVar3;
  uint32 uVar4;
  uint32 first_byte_or_zero;
  bool bVar5;
  uint64 local_38;
  uint64 buffer64;
  
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    uVar4 = (uint32)*pbVar3;
    if ((char)*pbVar3 < '\0') goto LAB_00335217;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
    uVar4 = 0;
LAB_00335217:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar4);
  }
  pCVar2->last_tag_ = uVar4;
  local_38 = 0;
  bVar5 = false;
  first_byte_or_zero = 0;
  if (uVar4 == 0) goto LAB_00335279;
  io::CodedInputStream::ReadVarint64(this->stream_,&local_38);
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    bVar1 = *pbVar3;
    first_byte_or_zero = (uint32)bVar1;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\0') goto LAB_0033525e;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
LAB_0033525e:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,first_byte_or_zero);
  }
  pCVar2->last_tag_ = uVar4;
  bVar5 = local_38 != 0;
LAB_00335279:
  (**(code **)(*(long *)field_name.length_ + 0x30))
            ((long *)field_name.length_,type,field_name.ptr_,bVar5);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderBool(const ProtoStreamObjectSource* os,
                                           const google::protobuf::Type& type,
                                           StringPiece field_name,
                                           ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint64 buffer64 = 0;  // results in 'false' value as default, which is the
                        // default value of Bool wrapper
  if (tag != 0) {
    os->stream_->ReadVarint64(&buffer64);
    os->stream_->ReadTag();
  }
  ow->RenderBool(field_name, buffer64 != 0);
  return util::Status();
}